

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

int pcut_count_tests(pcut_item_t *it)

{
  int count;
  int iVar1;
  
  iVar1 = 0;
  for (; it != (pcut_item_t *)0x0; it = pcut_get_real_next(it)) {
    iVar1 = iVar1 + (uint)(it->kind == 5);
  }
  return iVar1;
}

Assistant:

int pcut_count_tests(pcut_item_t *it) {
	int count = 0;
	while (it != NULL) {
		if (it->kind == PCUT_KIND_TEST) {
			count++;
		}
		it = pcut_get_real_next(it);
	}
	return count;
}